

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall QLocale::pmText(QString *__return_storage_ptr__,QLocale *this)

{
  QLocaleData *pQVar1;
  QSystemLocale *pQVar2;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = ((this->d).d.ptr)->m_data;
  if (pQVar1 == &systemLocaleData) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = systemLocale();
    local_58._16_8_ = 0;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_40 = 2;
    (*pQVar2->_vptr_QSystemLocale[2])(&local_38,pQVar2,0x1c);
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_38);
    ::QVariant::~QVariant((QVariant *)&local_38);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if ((__return_storage_ptr__->d).size != 0) goto LAB_002de3ea;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&__return_storage_ptr__->d);
    pQVar1 = ((this->d).d.ptr)->m_data;
  }
  local_38.shared =
       (PrivateShared *)
       ((ulong)pQVar1->m_postMeridiem_size << 0x20 | (ulong)pQVar1->m_postMeridiem_idx);
  QLocaleData::DataRange::getData
            (__return_storage_ptr__,(DataRange *)&local_38.shared,
             L"PMnm.a.kEWe pasditesከሰዓትمde la tardeichamthiПМcɛɛ́nkoI ɓugajɔpakasubapamunyiसांझबेलासेpopodneпослије поднеG.M.сл.об.ညနေ下午p.\xa0m.Ḍeffir azaد.نᏒᎯᏱᎢᏗᏢUhr nommendaachsp.m.odp.दपैहर बादebyámuཕྱི་ཆ་UT𐐑𐐣pm𐑐𐑥ptmɣetrɔngəgógəleip.soirkikiiɗe𞤇𞤎SHWANEμ.μ.MogYammadu.e.h.N’abaliep.pos midíi.n.午後Wengin tmedditkooskolinyĨyawĩooپی ایمपी एमHwaĩ-inĩसांजेsanje오후AluulaPNkugúтүштөн кийинкиMUUຫຼັງທ່ຽງpēcpusdienāmpókwapopietwótpołdnjaDiloloOTnomëttesпопл.kyiukonyimchochil’lChiloPTGপি এমƐndámâŨGү.х.ᠦ᠂ ᠬᠣlilliǃuiasअपराह्नncwònzémŋka mbɔ́t njiFọ ívninߥeahketbeaivete.m.TŊWBӕмбисбоны фӕстӕغ.و.بعدازظهرda tardepa pussideinanਬਾ.ਦੁ.kingotoZ.MW.ЭКTeipaLKPashamiheᱧᱤᱫᱟᱹпо поднеpo podnenyiaghuoꁯꋒpo połedniuمنجهند، شامशाम जाප.ව.pop.EiguloGDThapamaⵜⴰⴷⴳⴳⵯⴰⵜemam Namittag܏ܒܛ\x200ctadggʷatluma lwa pZaarikay bEbongiหลังเที่ยงཕྱི་དྲོ་ድ.ቀ.efiafiÖSgünortadan soňппpopołdnjuچۈشتىن كېيىنTKТКCHyhNgokisɛ́ndɛנאָכמיטאָגỌ̀sánƆ̀sánbanringzgvaqसांमpi pini sunoʊshilè kʊsasʊदपेहरा/संजाପି ଏମపి ఎమ్ᐲᒼ"
            );
LAB_002de3ea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::pmText() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        auto res = systemLocale()->query(QSystemLocale::PMText).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    return d->m_data->postMeridiem().getData(pm_data);
}